

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

bool __thiscall glslang::TProgram::crossStageCheck(TProgram *this,EShMessages messages)

{
  TIntermediate *pTVar1;
  TInfoSink *pTVar2;
  int iVar3;
  EProfile p;
  size_type sVar4;
  reference ppTVar5;
  SpvVersion *s_00;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  bool bVar6;
  uint local_b68;
  uint local_b64;
  uint i_3;
  uint i_2;
  uint uStack_b58;
  bool mergeExistingOnly;
  uint i_1;
  uint i;
  bool error;
  undefined1 local_b48 [8];
  TIntermAggregate root;
  TIntermAggregate uniformObjects;
  TIntermediate uniforms;
  TIntermediate *firstIntermediate;
  undefined1 local_40 [4];
  int s;
  TVector<glslang::TIntermediate_*> activeStages;
  EShMessages messages_local;
  TProgram *this_local;
  
  activeStages.
  super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>.
  super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = messages;
  TVector<glslang::TIntermediate_*>::TVector((TVector<glslang::TIntermediate_*> *)local_40);
  for (firstIntermediate._4_4_ = 0; firstIntermediate._4_4_ < 0xe;
      firstIntermediate._4_4_ = firstIntermediate._4_4_ + 1) {
    if (this->intermediate[firstIntermediate._4_4_] != (TIntermediate *)0x0) {
      std::vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>::
      push_back((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                 *)local_40,this->intermediate + firstIntermediate._4_4_);
    }
  }
  sVar4 = std::vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
          ::size((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                  *)local_40);
  if (sVar4 < 2) {
    bVar6 = true;
  }
  else {
    ppTVar5 = std::
              vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>::
              front((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                     *)local_40);
    pTVar1 = *ppTVar5;
    iVar3 = TIntermediate::getVersion(pTVar1);
    p = TIntermediate::getProfile(pTVar1);
    TIntermediate::TIntermediate
              ((TIntermediate *)&uniformObjects.endLoc.column,EShLangCount,iVar3,p);
    s_00 = TIntermediate::getSpv(pTVar1);
    TIntermediate::setSpv((TIntermediate *)&uniformObjects.endLoc.column,s_00);
    TIntermAggregate::TIntermAggregate((TIntermAggregate *)&root.endLoc.column,EOpLinkerObjects);
    TIntermAggregate::TIntermAggregate((TIntermAggregate *)local_b48,EOpSequence);
    this_00 = &TIntermAggregate::getSequence((TIntermAggregate *)local_b48)->
               super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>;
    _i = (value_type)&root.endLoc.column;
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
              (this_00,(value_type *)&i);
    TIntermediate::setTreeRoot
              ((TIntermediate *)&uniformObjects.endLoc.column,(TIntermNode *)local_b48);
    for (uStack_b58 = 0;
        sVar4 = std::
                vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                ::size((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        *)local_40), uStack_b58 < sVar4; uStack_b58 = uStack_b58 + 1) {
      pTVar2 = this->infoSink;
      ppTVar5 = std::
                vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                ::operator[]((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                              *)local_40,(ulong)uStack_b58);
      TIntermediate::mergeUniformObjects
                ((TIntermediate *)&uniformObjects.endLoc.column,pTVar2,*ppTVar5);
    }
    iVar3 = TIntermediate::getNumErrors((TIntermediate *)&uniformObjects.endLoc.column);
    bVar6 = iVar3 != 0;
    for (i_2 = 0; sVar4 = std::
                          vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                          ::size((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                                  *)local_40), i_2 < sVar4; i_2 = i_2 + 1) {
      ppTVar5 = std::
                vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                ::operator[]((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                              *)local_40,(ulong)i_2);
      TIntermediate::mergeGlobalUniformBlocks
                (*ppTVar5,this->infoSink,(TIntermediate *)&uniformObjects.endLoc.column,true);
    }
    for (local_b64 = 1;
        sVar4 = std::
                vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                ::size((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        *)local_40), local_b64 < sVar4; local_b64 = local_b64 + 1) {
      ppTVar5 = std::
                vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                ::operator[]((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                              *)local_40,(ulong)(local_b64 - 1));
      pTVar1 = *ppTVar5;
      pTVar2 = this->infoSink;
      ppTVar5 = std::
                vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                ::operator[]((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                              *)local_40,(ulong)local_b64);
      TIntermediate::checkStageIO(pTVar1,pTVar2,*ppTVar5);
      ppTVar5 = std::
                vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                ::operator[]((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                              *)local_40,(ulong)(local_b64 - 1));
      iVar3 = TIntermediate::getNumErrors(*ppTVar5);
      bVar6 = bVar6 || iVar3 != 0;
    }
    if ((activeStages.
         super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>.
         super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & EShMsgLinkTimeOptimization) !=
        EShMsgDefault) {
      for (local_b68 = 1;
          sVar4 = std::
                  vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                  ::size((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                          *)local_40), local_b68 < sVar4; local_b68 = local_b68 + 1) {
        ppTVar5 = std::
                  vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                  ::operator[]((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                                *)local_40,(ulong)(local_b68 - 1));
        pTVar1 = *ppTVar5;
        pTVar2 = this->infoSink;
        ppTVar5 = std::
                  vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                  ::operator[]((vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                                *)local_40,(ulong)local_b68);
        TIntermediate::optimizeStageIO(pTVar1,pTVar2,*ppTVar5);
      }
    }
    bVar6 = (bool)(bVar6 ^ 1);
    TIntermAggregate::~TIntermAggregate((TIntermAggregate *)local_b48);
    TIntermAggregate::~TIntermAggregate((TIntermAggregate *)&root.endLoc.column);
    TIntermediate::~TIntermediate((TIntermediate *)&uniformObjects.endLoc.column);
  }
  TVector<glslang::TIntermediate_*>::~TVector((TVector<glslang::TIntermediate_*> *)local_40);
  return bVar6;
}

Assistant:

bool TProgram::crossStageCheck(EShMessages messages) {

    // make temporary intermediates to hold the linkage symbols for each linking interface
    // while we do the checks
    // Independent interfaces are:
    //                  all uniform variables and blocks
    //                  all buffer blocks
    //                  all in/out on a stage boundary

    TVector<TIntermediate*> activeStages;
    for (int s = 0; s < EShLangCount; ++s) {
        if (intermediate[s])
            activeStages.push_back(intermediate[s]);
    }

    // no extra linking if there is only one stage
    if (! (activeStages.size() > 1))
        return true;

    // setup temporary tree to hold unfirom objects from different stages
    TIntermediate* firstIntermediate = activeStages.front();
    TIntermediate uniforms(EShLangCount,
                           firstIntermediate->getVersion(),
                           firstIntermediate->getProfile());
    uniforms.setSpv(firstIntermediate->getSpv());

    TIntermAggregate uniformObjects(EOpLinkerObjects);
    TIntermAggregate root(EOpSequence);
    root.getSequence().push_back(&uniformObjects);
    uniforms.setTreeRoot(&root);

    bool error = false;

    // merge uniforms from all stages into a single intermediate
    for (unsigned int i = 0; i < activeStages.size(); ++i) {
        uniforms.mergeUniformObjects(*infoSink, *activeStages[i]);
    }
    error |= uniforms.getNumErrors() != 0;

    // copy final definition of global block back into each stage
    for (unsigned int i = 0; i < activeStages.size(); ++i) {
        // We only want to merge into already existing global uniform blocks.
        // A stage that doesn't already know about the global doesn't care about it's content.
        // Otherwise we end up pointing to the same object between different stages
        // and that will break binding/set remappings
        bool mergeExistingOnly = true;
        activeStages[i]->mergeGlobalUniformBlocks(*infoSink, uniforms, mergeExistingOnly);
    }

    // compare cross stage symbols for each stage boundary
    for (unsigned int i = 1; i < activeStages.size(); ++i) {
        activeStages[i - 1]->checkStageIO(*infoSink, *activeStages[i]);
        error |= (activeStages[i - 1]->getNumErrors() != 0);
    }

    // if requested, optimize cross stage IO
    if (messages & EShMsgLinkTimeOptimization) {
        for (unsigned int i = 1; i < activeStages.size(); ++i) {
            activeStages[i - 1]->optimizeStageIO(*infoSink, *activeStages[i]);
        }
    }

    return !error;
}